

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.hpp
# Opt level: O0

void __thiscall
spirv_cross::ParsedIR::
for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerGLSL::replace_illegal_names(std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&)::__2>
          (ParsedIR *this,anon_class_16_2_5213c5e5 *op)

{
  LoopLock this_00;
  uint32_t uVar1;
  Types TVar2;
  uint32_t id_00;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *this_01;
  SPIRType *type;
  TypedID<(spirv_cross::Types)0> *id;
  TypedID<(spirv_cross::Types)0> *__end0;
  TypedID<(spirv_cross::Types)0> *__begin0;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range2;
  LoopLock loop_lock;
  anon_class_16_2_5213c5e5 *op_local;
  ParsedIR *this_local;
  
  loop_lock.lock = (uint32_t *)op;
  create_loop_hard_lock((ParsedIR *)&__range2);
  __end0 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                     (&this->ids_for_type[1].
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
  pTVar3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                     (&this->ids_for_type[1].
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
  for (; __end0 != pTVar3; __end0 = __end0 + 1) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end0);
    this_01 = VectorView<spirv_cross::Variant>::operator[]
                        (&(this->ids).super_VectorView<spirv_cross::Variant>,(ulong)uVar1);
    TVar2 = Variant::get_type(this_01);
    this_00 = loop_lock;
    if (TVar2 == TypeType) {
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end0);
      id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end0);
      type = get<spirv_cross::SPIRType>(this,id_00);
      CompilerGLSL::replace_illegal_names::anon_class_16_2_5213c5e5::operator()
                ((anon_class_16_2_5213c5e5 *)this_00.lock,uVar1,type);
    }
  }
  LoopLock::~LoopLock((LoopLock *)&__range2);
  return;
}

Assistant:

void for_each_typed_id(const Op &op)
	{
		auto loop_lock = create_loop_hard_lock();
		for (auto &id : ids_for_type[T::type])
		{
			if (ids[id].get_type() == static_cast<Types>(T::type))
				op(id, get<T>(id));
		}
	}